

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

alpn_spec * alpn_get_spec(http_majors allowed,_Bool use_alpn)

{
  _Bool use_alpn_local;
  alpn_spec *paStack_10;
  http_majors allowed_local;
  
  if (use_alpn) {
    paStack_10 = &ALPN_SPEC_H11;
  }
  else {
    paStack_10 = (alpn_spec *)0x0;
  }
  return paStack_10;
}

Assistant:

static const struct alpn_spec *
alpn_get_spec(http_majors allowed, bool use_alpn)
{
  if(!use_alpn)
    return NULL;
#ifdef USE_HTTP2
  if(allowed & CURL_HTTP_V2x) {
    if(allowed & CURL_HTTP_V1x)
      return &ALPN_SPEC_H2_H11;
    return &ALPN_SPEC_H2;
  }
#else
  (void)allowed;
#endif
  /* Use the ALPN protocol "http/1.1" for HTTP/1.x.
     Avoid "http/1.0" because some servers do not support it. */
  return &ALPN_SPEC_H11;
}